

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmLocalGenerator *localGenerator;
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  string *psVar3;
  cmGeneratorTarget *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar11;
  cmGeneratorExpressionInterpreter *this;
  ostream *poVar12;
  size_t sVar13;
  uint uVar14;
  pointer ppcVar15;
  char *pcVar16;
  bool bVar17;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  uint local_2e8;
  cmGeneratorExpressionInterpreter *local_2e0;
  string local_2d8;
  string *local_2b8;
  string local_2b0;
  cmGeneratorTarget *local_290;
  string local_288;
  _Base_ptr local_268;
  _Base_ptr local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  string local_248;
  char *local_228;
  pointer local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  undefined1 local_200 [112];
  ios_base local_190 [264];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  bVar8 = cmTarget::GetPropertyAsBool(tgt->Target,p);
  local_2e8 = (uint)bVar8;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var10 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar17 = _Var10._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_260 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_258 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_268 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_250 = _Var10._M_current;
  if (local_260 != local_268 &&
      _Var10._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar11 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar11->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar11->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_288,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
    local_228 = defaultValue;
    if (local_250 != local_258) {
      std::__cxx11::string::append((char *)&local_288);
      pcVar16 = "FALSE";
      if (bVar8) {
        pcVar16 = "TRUE";
      }
      local_200._0_8_ = local_200 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,pcVar16,pcVar16 + ((ulong)bVar8 ^ 5));
      std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_288);
    std::operator+(&local_68,"INTERFACE_",p);
    iVar9 = std::__cxx11::string::compare((char *)p);
    local_2b8 = p;
    if (iVar9 == 0) {
      this = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      localGenerator = tgt->LocalGenerator;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar1,pcVar1 + config->_M_string_length);
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this,localGenerator,&local_248,tgt,&local_88);
      p = local_2b8;
      local_2e0 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_2e0 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    ppcVar15 = (pvVar11->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_220 = (pvVar11->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = tgt;
    if (ppcVar15 != local_220) {
      do {
        local_290 = pcVar2;
        pcVar2 = *ppcVar15;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_218,pcVar2);
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (local_218.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_218.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar7 = local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar8 = getTypedProperty<bool>(pcVar2,&local_68,local_2e0);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        local_2d8._M_string_length = 0;
        local_2d8.field_2._M_local_buf[0] = '\0';
        if (_Var10._M_current == pbVar7) {
          uVar14 = local_2e8;
          if (local_260 != local_268) {
            uVar14 = 0;
          }
          if (local_250 != local_258) {
            uVar14 = local_2e8;
          }
          iVar9 = 3;
          local_2e8 = uVar14;
        }
        else {
          std::__cxx11::string::append((char *)&local_2d8);
          pbVar6 = local_250;
          pbVar5 = local_258;
          std::__cxx11::string::_M_append
                    ((char *)&local_2d8,(ulong)(pcVar2->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_2d8);
          pcVar16 = "FALSE";
          if (bVar8) {
            pcVar16 = "TRUE";
          }
          local_200._0_8_ = local_200 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,pcVar16,pcVar16 + ((ulong)bVar8 ^ 5));
          std::__cxx11::string::_M_append((char *)&local_2d8,local_200._0_8_);
          if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
            operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_2d8);
          if (pbVar6 == pbVar5) {
            if (local_260 == local_268) {
              if (bVar17) {
                std::__cxx11::string::_M_append
                          ((char *)&local_288,(ulong)local_2d8._M_dataplus._M_p);
                compatibilityAgree_abi_cxx11_((string *)local_200,t,false);
                std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                }
                iVar9 = 3;
                bVar17 = true;
                bVar8 = bVar8 != local_2e8._0_1_;
                if (bVar8) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,"The INTERFACE_",0xe);
                  pcVar4 = local_290;
                  psVar3 = local_2b8;
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,(local_2b8->_M_dataplus)._M_p,
                                       local_2b8->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," property of \"",0xe);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(pcVar2->Target->Name)._M_dataplus._M_p,
                                       (pcVar2->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,"\" does\nnot agree with the value of ",0x23);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12," already determined\nfor \"",0x19);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(pcVar4->Target->Name)._M_dataplus._M_p,
                                       (pcVar4->Target->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error(&local_2b0);
                  goto LAB_0033afa0;
                }
              }
              else {
                local_200._0_8_ = local_200 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_200,local_2d8._M_dataplus._M_p,
                           local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
                std::__cxx11::string::append((char *)local_200);
                std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                }
                iVar9 = 0;
                bVar17 = true;
                local_2e8 = (uint)bVar8;
              }
            }
            else {
              std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d8._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_((string *)local_200,t,false);
              std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
              if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
              }
              if (bVar8) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                pcVar4 = local_290;
                psVar3 = local_2b8;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"Property ",9);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_200,(psVar3->_M_dataplus)._M_p,
                                     psVar3->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(pcVar4->Target->Name)._M_dataplus._M_p,
                                     (pcVar4->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is\nimplied to be ",0x13);
                pcVar16 = local_228;
                if (local_228 == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar13 = strlen(local_228);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar16,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," property on\ndependency \"",0x19);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(pcVar2->Target->Name)._M_dataplus._M_p,
                                     (pcVar2->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_2b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                  operator_delete(local_2b0._M_dataplus._M_p,
                                  local_2b0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                std::ios_base::~ios_base(local_190);
                iVar9 = 2;
              }
              else {
                iVar9 = 3;
              }
              local_2e8 = 0;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d8._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_((string *)local_200,t,false);
            std::__cxx11::string::_M_append((char *)&local_288,local_200._0_8_);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
            }
            iVar9 = 3;
            bVar8 = bVar8 != local_2e8._0_1_;
            if (bVar8) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"Property ",9)
              ;
              pcVar4 = local_290;
              psVar3 = local_2b8;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_200,(local_2b8->_M_dataplus)._M_p,
                                   local_2b8->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," on target \"",0xc);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(pcVar4->Target->Name)._M_dataplus._M_p,
                                   (pcVar4->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\" does\nnot match the INTERFACE_",0x1f);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," property requirement\nof dependency \"",0x25);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(pcVar2->Target->Name)._M_dataplus._M_p,
                                   (pcVar2->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_2b0);
LAB_0033afa0:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
              std::ios_base::~ios_base(local_190);
              iVar9 = 2;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,
                          CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                   local_2d8.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_218);
        p = local_2b8;
        tgt = local_290;
      } while (((iVar9 == 3) || (iVar9 == 0)) &&
              (ppcVar15 = ppcVar15 + 1, pcVar2 = local_290, ppcVar15 != local_220));
    }
    iVar9 = 0x4d919d;
    if (local_2e8 != 0) {
      iVar9 = 0x4d0ff4;
    }
    local_200._0_8_ = local_200 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,iVar9,(local_2e8 ^ 5) + iVar9);
    compatibilityType_abi_cxx11_(&local_2d8,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,(string *)local_200,&local_288,&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if (local_2e0 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2e0,local_2e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar8 = local_2e8._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  local_2e8._0_1_ = bVar8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2e8._0_1_;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}